

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  cmTarget *pcVar1;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar2;
  char *pcVar3;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator local_141;
  undefined1 local_140 [8];
  undefined1 local_138 [16];
  undefined1 local_128 [24];
  undefined8 local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  cmGeneratorExpression local_f8;
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_90;
  cmListFileBacktrace local_58;
  
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"AUTOUIC_OPTIONS","");
  pcVar3 = checkInterfacePropertyCompatibility<char_const*>
                     (this,(string *)local_d8,config,"empty",StringType,(char **)0x0);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (pcVar3 != (char *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_d8);
    cmGeneratorExpression::cmGeneratorExpression(&local_f8,(cmListFileBacktrace *)local_d8);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_d8);
    pcVar1 = this->Target;
    pcVar2 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_138 + 0x10);
    local_138._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_140 + 8),"AUTOUIC_OPTIONS","");
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_d8,&pcVar1->Name,(string *)(local_140 + 8),
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_138._0_8_ != pcVar2) {
      operator_delete((void *)local_138._0_8_,
                      (ulong)((long)&(((cmListFileContext *)local_128._0_8_)->Name)._M_dataplus._M_p
                             + 1));
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(char *)&local_f8);
    local_110 = 0;
    local_108._M_local_buf[0] = '\0';
    local_128._16_8_ = &local_108;
    pcVar3 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_140,this->LocalGenerator,config,false
                        ,this,(cmGeneratorExpressionDAGChecker *)local_d8,
                        (string *)(local_128 + 0x10));
    std::__cxx11::string::string((string *)(local_140 + 8),pcVar3,&local_141);
    cmSystemTools::ExpandListArgument((string *)(local_140 + 8),result,false);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_138._0_8_ != pcVar2) {
      operator_delete((void *)local_138._0_8_,
                      (ulong)((long)&(((cmListFileContext *)local_128._0_8_)->Name)._M_dataplus._M_p
                             + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._16_8_ != &local_108) {
      operator_delete((void *)local_128._16_8_,
                      CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1)
      ;
    }
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_140);
    cmListFileBacktrace::~cmListFileBacktrace(&local_58);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._8_8_ != &local_c0) {
      operator_delete((void *)local_d8._8_8_,local_c0._0_8_ + 1);
    }
    cmGeneratorExpression::~cmGeneratorExpression(&local_f8);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string>& result,
                                          const std::string& config) const
{
  const char* prop =
    this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS", config);
  if (!prop) {
    return;
  }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
    this->GetName(), "AUTOUIC_OPTIONS", CM_NULLPTR, CM_NULLPTR);
  cmSystemTools::ExpandListArgument(
    ge.Parse(prop)->Evaluate(this->LocalGenerator, config, false, this,
                             &dagChecker),
    result);
}